

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-debugchannel.c
# Opt level: O0

int lwrite(lua_State *L)

{
  char *s;
  char *str;
  size_t sz;
  channel_box *cb;
  lua_State *L_local;
  
  cb = (channel_box *)L;
  sz = (size_t)luaL_checkudata(L,1,"debugchannel");
  s = luaL_checklstring((lua_State *)cb,2,(size_t *)&str);
  channel_write(*(channel **)sz,s,(size_t)str);
  return 0;
}

Assistant:

static int
lwrite(lua_State *L) {
	struct channel_box *cb = luaL_checkudata(L,1, METANAME);
	size_t sz;
	const char * str = luaL_checklstring(L, 2, &sz);
	channel_write(cb->c, str, sz);
	return 0;
}